

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS ref_collapse_diagnostics(REF_GRID ref_grid)

{
  uint node1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  REF_BOOL has_side;
  REF_DBL edge_ratio;
  REF_EDGE ref_edge;
  uint local_44;
  double local_40;
  REF_EDGE local_38;
  
  ref_node = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  uVar1 = ref_edge_create(&local_38,ref_grid);
  if (uVar1 == 0) {
    if (0 < local_38->n) {
      lVar5 = 0;
      do {
        uVar1 = local_38->e2n[lVar5 * 2];
        node1 = local_38->e2n[lVar5 * 2 + 1];
        uVar2 = ref_node_ratio(ref_node,uVar1,node1,&local_40);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x34,"ref_collapse_diagnostics",(ulong)uVar2,"ratio");
          return uVar2;
        }
        if (local_40 < ref_grid->adapt->post_min_ratio + 0.1) {
          uVar2 = ref_cell_has_side(ref_cell,uVar1,node1,(REF_BOOL *)&local_44);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                   ,0x36,"ref_collapse_diagnostics",(ulong)uVar2,"side");
            return uVar2;
          }
          uVar3 = 0;
          uVar4 = 0;
          if ((-1 < (int)uVar1) && ((int)uVar1 < ref_cell->ref_adj->nnode)) {
            uVar4 = (ulong)(ref_cell->ref_adj->first[uVar1] != -1);
          }
          if ((-1 < (int)node1) && ((int)node1 < ref_cell->ref_adj->nnode)) {
            uVar3 = (ulong)(ref_cell->ref_adj->first[node1] != -1);
          }
          printf("ratio %f bound nodes %d %d tri edge %d\n",local_40,uVar4,uVar3,(ulong)local_44);
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_38->n);
    }
    uVar1 = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",0x30
           ,"ref_collapse_diagnostics",(ulong)uVar1,"orig edges");
  }
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_diagnostics(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_INT edge, node0, node1;
  REF_DBL edge_ratio;
  REF_BOOL has_side;
  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    if (edge_ratio < 0.1 + ref_grid_adapt(ref_grid, post_min_ratio)) {
      RSS(ref_cell_has_side(ref_cell, node0, node1, &has_side), "side");
      printf("ratio %f bound nodes %d %d tri edge %d\n", edge_ratio,
             !ref_cell_node_empty(ref_cell, node0),
             !ref_cell_node_empty(ref_cell, node1), has_side);
    }
  }

  return REF_SUCCESS;
}